

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigrp-packet.cc
# Opt level: O0

void __thiscall EigrpPacket::Print(EigrpPacket *this,ostream *os)

{
  bool bVar1;
  ostream *poVar2;
  element_type *peVar3;
  ostream *in_RSI;
  vector<std::shared_ptr<Tlv>,_std::allocator<std::shared_ptr<Tlv>_>_> *in_RDI;
  shared_ptr<Tlv> *var;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<Tlv>,_std::allocator<std::shared_ptr<Tlv>_>_> *__range1;
  reference in_stack_ffffffffffffffd0;
  __normal_iterator<std::shared_ptr<Tlv>_*,_std::vector<std::shared_ptr<Tlv>,_std::allocator<std::shared_ptr<Tlv>_>_>_>
  local_20;
  pointer *local_18;
  ostream *local_10;
  
  local_10 = in_RSI;
  poVar2 = std::operator<<(in_RSI,"Eigrp Packet:");
  std::operator<<(poVar2,'\n');
  poVar2 = std::operator<<(local_10,'\t');
  poVar2 = std::operator<<(poVar2,"opcode: ");
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,(ushort)*(byte *)((long)&in_RDI[1].
                                                                                                            
                                                  super__Vector_base<std::shared_ptr<Tlv>,_std::allocator<std::shared_ptr<Tlv>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 4));
  std::operator<<(poVar2,'\n');
  poVar2 = std::operator<<(local_10,'\t');
  poVar2 = std::operator<<(poVar2,"flags: ");
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,*(uint *)&in_RDI[1].
                                       super__Vector_base<std::shared_ptr<Tlv>,_std::allocator<std::shared_ptr<Tlv>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish);
  std::operator<<(poVar2,'\n');
  poVar2 = std::operator<<(local_10,'\t');
  poVar2 = std::operator<<(poVar2,"virtual router id: ");
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,*(ushort *)
                              ((long)&in_RDI[1].
                                      super__Vector_base<std::shared_ptr<Tlv>,_std::allocator<std::shared_ptr<Tlv>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish + 4));
  std::operator<<(poVar2,'\n');
  poVar2 = std::operator<<(local_10,'\t');
  poVar2 = std::operator<<(poVar2,"autonomous system: ");
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,*(ushort *)
                              ((long)&in_RDI[1].
                                      super__Vector_base<std::shared_ptr<Tlv>,_std::allocator<std::shared_ptr<Tlv>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish + 6));
  std::operator<<(poVar2,'\n');
  std::ostream::operator<<(local_10,std::endl<char,std::char_traits<char>>);
  local_18 = &in_RDI[1].
              super__Vector_base<std::shared_ptr<Tlv>,_std::allocator<std::shared_ptr<Tlv>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_20._M_current =
       (shared_ptr<Tlv> *)
       std::vector<std::shared_ptr<Tlv>,_std::allocator<std::shared_ptr<Tlv>_>_>::begin(in_RDI);
  std::vector<std::shared_ptr<Tlv>,_std::allocator<std::shared_ptr<Tlv>_>_>::end(in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::shared_ptr<Tlv>_*,_std::vector<std::shared_ptr<Tlv>,_std::allocator<std::shared_ptr<Tlv>_>_>_>
                        *)in_stack_ffffffffffffffd0,
                       (__normal_iterator<std::shared_ptr<Tlv>_*,_std::vector<std::shared_ptr<Tlv>,_std::allocator<std::shared_ptr<Tlv>_>_>_>
                        *)in_RDI);
    if (!bVar1) break;
    in_stack_ffffffffffffffd0 =
         __gnu_cxx::
         __normal_iterator<std::shared_ptr<Tlv>_*,_std::vector<std::shared_ptr<Tlv>,_std::allocator<std::shared_ptr<Tlv>_>_>_>
         ::operator*(&local_20);
    peVar3 = std::__shared_ptr_access<Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x14f0dd);
    (*peVar3->_vptr_Tlv[2])(peVar3,local_10);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<Tlv>_*,_std::vector<std::shared_ptr<Tlv>,_std::allocator<std::shared_ptr<Tlv>_>_>_>
    ::operator++(&local_20);
  }
  std::ostream::operator<<(local_10,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void EigrpPacket::Print(std::ostream& os)
{
    os << "Eigrp Packet:" << '\n';
    os << '\t' << "opcode: " << (uint16_t)opcode << '\n';
    os << '\t' << "flags: " << flags << '\n';
    os << '\t' << "virtual router id: " << v_router << '\n';
    os << '\t' << "autonomous system: " << as << '\n';
    os << std::endl;

    for (auto& var : tlvs)
    {
        var->Print(os);
    }
    os << std::endl;
}